

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
::split(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
        *this,int insert_position,
       btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
       *dest,allocator_type *alloc)

{
  allocator_type *paVar1;
  field_type fVar2;
  field_type fVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *pbVar7;
  int local_34;
  slot_type *psStack_30;
  int i;
  allocator_type *local_28;
  allocator_type *alloc_local;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *dest_local;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *pbStack_10;
  int insert_position_local;
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
  *this_local;
  
  local_28 = alloc;
  alloc_local = (allocator_type *)dest;
  dest_local._4_4_ = insert_position;
  pbStack_10 = this;
  fVar2 = count(dest);
  if (fVar2 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8fb,
                  "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                 );
  }
  fVar2 = max_count(this);
  paVar1 = alloc_local;
  if (fVar2 != '\x1e') {
    __assert_fail("max_count() == kNodeValues",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8fc,
                  "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                 );
  }
  if (dest_local._4_4_ == 0) {
    fVar2 = count(this);
    set_count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
               *)paVar1,fVar2 + 0xff);
  }
  else if (dest_local._4_4_ == 0x1e) {
    set_count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
               *)alloc_local,'\0');
  }
  else {
    bVar4 = count(this);
    set_count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
               *)paVar1,bVar4 / 2);
  }
  fVar2 = count(this);
  fVar3 = count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                 *)alloc_local);
  set_count(this,fVar2 - fVar3);
  fVar2 = count(this);
  if (fVar2 == '\0') {
    __assert_fail("count() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x90a,
                  "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                 );
  }
  bVar4 = count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                 *)alloc_local);
  bVar5 = count(this);
  uninitialized_move_n
            (this,(ulong)bVar4,(ulong)bVar5,0,
             (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              *)alloc_local,local_28);
  bVar4 = count(this);
  bVar5 = count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                 *)alloc_local);
  value_destroy_n(this,(ulong)bVar4,(ulong)bVar5,local_28);
  fVar2 = count(this);
  set_count(this,fVar2 + 0xff);
  pbVar7 = parent(this);
  bVar4 = position(this);
  paVar1 = local_28;
  bVar5 = count(this);
  psStack_30 = slot(this,(ulong)bVar5);
  btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,true>>
  ::
  emplace_value<phmap::priv::map_slot_type<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>
            ((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,true>>
              *)pbVar7,(ulong)bVar4,paVar1,&stack0xffffffffffffffd0);
  bVar4 = count(this);
  value_destroy(this,(ulong)bVar4,local_28);
  pbVar7 = parent(this);
  bVar4 = position(this);
  init_child(pbVar7,bVar4 + 1,
             (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
              *)alloc_local);
  bVar6 = leaf(this);
  if (!bVar6) {
    for (local_34 = 0;
        bVar4 = count((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                       *)alloc_local), local_34 <= (int)(uint)bVar4; local_34 = local_34 + 1) {
      bVar4 = count(this);
      pbVar7 = child(this,(long)(int)((uint)bVar4 + local_34 + 1));
      paVar1 = alloc_local;
      if (pbVar7 == (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                     *)0x0) {
        __assert_fail("child(count() + i + 1) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x91a,
                      "void phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, true>]"
                     );
      }
      bVar4 = count(this);
      pbVar7 = child(this,(long)(int)((uint)bVar4 + local_34 + 1));
      init_child((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
                  *)paVar1,local_34,pbVar7);
      bVar4 = count(this);
      clear_child(this,(long)(int)((uint)bVar4 + local_34 + 1));
    }
  }
  return;
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }